

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O1

void lj_dispatch_stitch(jit_State *J,BCIns *pc)

{
  int iVar1;
  undefined4 uVar2;
  lua_State *plVar3;
  TValue *pTVar4;
  BCReg BVar5;
  int *piVar6;
  ulong uVar7;
  
  piVar6 = __errno_location();
  iVar1 = *piVar6;
  plVar3 = J->L;
  uVar7 = (ulong)plVar3->cframe & 0xfffffffffffffffc;
  uVar2 = *(undefined4 *)(uVar7 + 0x1c);
  *(int *)(uVar7 + 0x1c) = (int)pc;
  pTVar4 = plVar3->base;
  BVar5 = cur_topslot((GCproto *)((ulong)*(uint *)((ulong)pTVar4[-1].u32.lo + 0x10) - 0x40),pc + 1,
                      *(uint32_t *)(uVar7 + 4));
  plVar3->top = pTVar4 + BVar5;
  lj_trace_stitch(J,pc + -1);
  *(undefined4 *)(uVar7 + 0x1c) = uVar2;
  *piVar6 = iVar1;
  return;
}

Assistant:

void LJ_FASTCALL lj_dispatch_stitch(jit_State *J, const BCIns *pc)
{
  ERRNO_SAVE
  lua_State *L = J->L;
  void *cf = cframe_raw(L->cframe);
  const BCIns *oldpc = cframe_pc(cf);
  setcframe_pc(cf, pc);
  /* Before dispatch, have to bias PC by 1. */
  L->top = L->base + cur_topslot(curr_proto(L), pc+1, cframe_multres_n(cf));
  lj_trace_stitch(J, pc-1);  /* Point to the CALL instruction. */
  setcframe_pc(cf, oldpc);
  ERRNO_RESTORE
}